

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  FileDescriptorProto *this_00;
  FileDescriptor *in_RSI;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *in_stack_00000170;
  Descriptor *in_stack_00000178;
  DescriptorBuilder *in_stack_00000180;
  int in_stack_ffffffffffffff9c;
  FileDescriptorProto *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  DescriptorBuilder *in_stack_ffffffffffffffb0;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(in_RSI);
    if (iVar1 <= local_1c) break;
    FileDescriptorProto::extension(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    ValidateProto3Field(this,(FieldDescriptor *)file,(FieldDescriptorProto *)proto);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(in_RSI);
    if (iVar1 <= local_20) break;
    in_stack_ffffffffffffffb0 =
         (DescriptorBuilder *)(*(long *)(in_RSI + 0x68) + (long)local_20 * 0x90);
    FileDescriptorProto::message_type(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    ValidateProto3Message(in_stack_00000180,in_stack_00000178,in_stack_00000170);
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = local_24;
    iVar2 = FileDescriptor::enum_type_count(in_RSI);
    if (iVar2 <= iVar1) break;
    this_00 = (FileDescriptorProto *)(*(long *)(in_RSI + 0x70) + (long)local_24 * 0x50);
    FileDescriptorProto::enum_type(this_00,in_stack_ffffffffffffff9c);
    ValidateProto3Enum(in_stack_ffffffffffffffb0,
                       (EnumDescriptor *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                       (EnumDescriptorProto *)this_00);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3(FileDescriptor* file,
                                       const FileDescriptorProto& proto) {
  for (int i = 0; i < file->extension_count(); ++i) {
    ValidateProto3Field(file->extensions_ + i, proto.extension(i));
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    ValidateProto3Message(file->message_types_ + i, proto.message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); ++i) {
    ValidateProto3Enum(file->enum_types_ + i, proto.enum_type(i));
  }
}